

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhash.c
# Opt level: O0

tommy_uint64_t tommy_hash_u64(tommy_uint64_t init_val,void *void_key,tommy_size_t key_len)

{
  long lVar1;
  tommy_uint32_t tVar2;
  tommy_uint32_t tVar3;
  tommy_uint32_t tVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  long in_FS_OFFSET;
  uint local_44;
  uint local_40;
  tommy_uint32_t c;
  tommy_uint32_t b;
  tommy_uint32_t a;
  uchar *key;
  tommy_size_t key_len_local;
  void *void_key_local;
  tommy_uint64_t init_val_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = (int)key_len + -0x21524111 + (int)init_val;
  local_44 = local_40 + (int)(init_val >> 0x20);
  c = local_40;
  _b = (byte *)void_key;
  for (key = (uchar *)key_len; (uchar *)0xc < key; key = key + -0xc) {
    tVar2 = tommy_le_uint32_read(_b);
    tVar3 = tommy_le_uint32_read(_b + 4);
    tVar4 = tommy_le_uint32_read(_b + 8);
    local_44 = tVar4 + local_44;
    uVar5 = (local_44 * 0x10 | local_44 >> 0x1c) ^ (tVar2 + c) - local_44;
    iVar6 = tVar3 + local_40 + local_44;
    uVar7 = (uVar5 << 6 | uVar5 >> 0x1a) ^ (tVar3 + local_40) - uVar5;
    iVar8 = iVar6 + uVar5;
    uVar5 = (uVar7 << 8 | uVar7 >> 0x18) ^ iVar6 - uVar7;
    iVar6 = iVar8 + uVar7;
    uVar7 = (uVar5 << 0x10 | uVar5 >> 0x10) ^ iVar8 - uVar5;
    iVar8 = iVar6 + uVar5;
    local_40 = (uVar7 << 0x13 | uVar7 >> 0xd) ^ iVar6 - uVar7;
    c = iVar8 + uVar7;
    local_44 = (local_40 << 4 | local_40 >> 0x1c) ^ iVar8 - local_40;
    local_40 = c + local_40;
    _b = _b + 0xc;
  }
  switch(key) {
  case (uchar *)0x0:
    init_val_local = CONCAT44(local_40,local_44);
    goto LAB_001067b2;
  case (uchar *)0x3:
    c = (uint)_b[2] * 0x10000 + c;
  case (uchar *)0x2:
    c = (uint)_b[1] * 0x100 + c;
  case (uchar *)0x1:
    c = *_b + c;
    break;
  case (uchar *)0x7:
    local_40 = (uint)_b[6] * 0x10000 + local_40;
  case (uchar *)0x6:
    local_40 = (uint)_b[5] * 0x100 + local_40;
  case (uchar *)0x5:
    local_40 = _b[4] + local_40;
  case (uchar *)0x4:
    tVar2 = tommy_le_uint32_read(_b);
    c = tVar2 + c;
    break;
  case (uchar *)0xb:
    local_44 = (uint)_b[10] * 0x10000 + local_44;
  case (uchar *)0xa:
    local_44 = (uint)_b[9] * 0x100 + local_44;
  case (uchar *)0x9:
    local_44 = _b[8] + local_44;
  case (uchar *)0x8:
    tVar2 = tommy_le_uint32_read(_b + 4);
    local_40 = tVar2 + local_40;
    tVar2 = tommy_le_uint32_read(_b);
    c = tVar2 + c;
    break;
  case (uchar *)0xc:
    tVar2 = tommy_le_uint32_read(_b + 8);
    local_44 = tVar2 + local_44;
    tVar2 = tommy_le_uint32_read(_b + 4);
    local_40 = tVar2 + local_40;
    tVar2 = tommy_le_uint32_read(_b);
    c = tVar2 + c;
  }
  uVar5 = (local_40 ^ local_44) - (local_40 << 0xe | local_40 >> 0x12);
  uVar7 = (uVar5 ^ c) - (uVar5 * 0x800 | uVar5 >> 0x15);
  uVar9 = (uVar7 ^ local_40) - (uVar7 * 0x2000000 | uVar7 >> 7);
  uVar5 = (uVar9 ^ uVar5) - (uVar9 * 0x10000 | uVar9 >> 0x10);
  uVar7 = (uVar5 ^ uVar7) - (uVar5 * 0x10 | uVar5 >> 0x1c);
  uVar7 = (uVar7 ^ uVar9) - (uVar7 * 0x4000 | uVar7 >> 0x12);
  init_val_local = CONCAT44(uVar7,(uVar7 ^ uVar5) - (uVar7 * 0x1000000 | uVar7 >> 8));
LAB_001067b2:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return init_val_local;
}

Assistant:

tommy_uint64_t tommy_hash_u64(tommy_uint64_t init_val, const void* void_key, tommy_size_t key_len)
{
	const unsigned char* key = tommy_cast(const unsigned char*, void_key);
	tommy_uint32_t a, b, c;

	a = b = c = 0xdeadbeef + ((tommy_uint32_t)key_len) + (init_val & 0xffffffff);
	c += init_val >> 32;

	while (key_len > 12) {
		a += tommy_le_uint32_read(key + 0);
		b += tommy_le_uint32_read(key + 4);
		c += tommy_le_uint32_read(key + 8);

		tommy_mix(a, b, c);

		key_len -= 12;
		key += 12;
	}

	switch (key_len) {
	case 0 :
		return c + ((tommy_uint64_t)b << 32); /* used only when called with a zero length */
	case 12 :
		c += tommy_le_uint32_read(key + 8);
		b += tommy_le_uint32_read(key + 4);
		a += tommy_le_uint32_read(key + 0);
		break;
	case 11 : c += ((tommy_uint32_t)key[10]) << 16; /* fallthrough */
	case 10 : c += ((tommy_uint32_t)key[9]) << 8; /* fallthrough */
	case 9 : c += key[8]; /* fallthrough */
	case 8 :
		b += tommy_le_uint32_read(key + 4);
		a += tommy_le_uint32_read(key + 0);
		break;
	case 7 : b += ((tommy_uint32_t)key[6]) << 16; /* fallthrough */
	case 6 : b += ((tommy_uint32_t)key[5]) << 8; /* fallthrough */
	case 5 : b += key[4]; /* fallthrough */
	case 4 :
		a += tommy_le_uint32_read(key + 0);
		break;
	case 3 : a += ((tommy_uint32_t)key[2]) << 16; /* fallthrough */
	case 2 : a += ((tommy_uint32_t)key[1]) << 8; /* fallthrough */
	case 1 : a += key[0]; /* fallthrough */
	}

	tommy_final(a, b, c);

	return c + ((tommy_uint64_t)b << 32);
}